

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

void __thiscall QPushButtonPrivate::resetLayoutItemMargins(QPushButtonPrivate *this)

{
  long lVar1;
  QPushButton *pQVar2;
  QPushButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QPushButton *q;
  QStyleOptionButton opt;
  QStyleOptionButton *this_00;
  QStyleOption *opt_00;
  LayoutDirection element;
  QWidgetPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  this_01 = (QWidgetPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt_00 = (QStyleOption *)&DAT_aaaaaaaaaaaaaaaa;
  element = 0xaaaaaaaa;
  this_00 = (QStyleOptionButton *)&stack0xffffffffffffff88;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x666490);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractButton).super_QWidget + 0x1b8))(pQVar2,this_00);
  QWidgetPrivate::setLayoutItemMargins(this_01,element,opt_00);
  QStyleOptionButton::~QStyleOptionButton(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButtonPrivate::resetLayoutItemMargins()
{
    Q_Q(QPushButton);
    QStyleOptionButton opt;
    q->initStyleOption(&opt);
    setLayoutItemMargins(QStyle::SE_PushButtonLayoutItem, &opt);
}